

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

ssize_t __thiscall just::file::write(file *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  output_file oStack_38;
  
  impl::output_file::output_file(&oStack_38,(string *)this);
  impl::output_file::write
            (&oStack_38,(int)*(undefined8 *)CONCAT44(in_register_00000034,__fd),
             (void *)((undefined8 *)CONCAT44(in_register_00000034,__fd))[1],__n);
  impl::output_file::~output_file(&oStack_38);
  return extraout_RAX;
}

Assistant:

inline void write(const std::string& filename_, const std::string& content_)
    {
      impl::output_file(filename_).write(content_.c_str(), content_.size());
    }